

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::
basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
::visit_begin_multi_dim
          (basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
           *this,span<const_unsigned_long,_18446744073709551615UL> *shape,semantic_tag tag,
          ser_context *context,error_code *ec)

{
  bool bVar1;
  ser_context *psVar2;
  ser_context *psVar3;
  uint64_t in_RCX;
  char in_DL;
  span<const_unsigned_long,_18446744073709551615UL> *in_RSI;
  error_code *in_RDI;
  error_code *in_R8;
  uint64_t in_stack_00000008;
  const_iterator it;
  undefined7 in_stack_00000028;
  size_t in_stack_00000040;
  basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
  *in_stack_00000048;
  ser_context *context_00;
  undefined7 in_stack_ffffffffffffffe0;
  
  if (in_DL == '\x10') {
    write_tag((basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
               *)it,in_stack_00000008);
  }
  else {
    write_tag((basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
               *)it,in_stack_00000008);
  }
  visit_begin_array(in_stack_00000048,in_stack_00000040,this._7_1_,(ser_context *)shape,
                    (error_code *)CONCAT17(tag,in_stack_00000028));
  bVar1 = std::error_code::operator_cast_to_bool(in_R8);
  if (!bVar1) {
    jsoncons::detail::span<const_unsigned_long,_18446744073709551615UL>::size(in_RSI);
    visit_begin_array(in_stack_00000048,in_stack_00000040,this._7_1_,(ser_context *)shape,
                      (error_code *)CONCAT17(tag,in_stack_00000028));
    bVar1 = std::error_code::operator_cast_to_bool(in_R8);
    if (!bVar1) {
      psVar2 = (ser_context *)
               jsoncons::detail::span<const_unsigned_long,_18446744073709551615UL>::begin(in_RSI);
      while (context_00 = psVar2,
            psVar3 = (ser_context *)
                     jsoncons::detail::span<const_unsigned_long,_18446744073709551615UL>::end
                               (in_RSI), psVar2 != psVar3) {
        visit_uint64((basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                      *)CONCAT17(in_DL,in_stack_ffffffffffffffe0),in_RCX,
                     (semantic_tag)((ulong)in_R8 >> 0x38),context_00,in_RDI);
        bVar1 = std::error_code::operator_cast_to_bool(in_R8);
        if (bVar1) {
          return true;
        }
        psVar2 = context_00 + 1;
      }
      visit_end_array((basic_cbor_encoder<jsoncons::bytes_sink<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<char>_>
                       *)CONCAT17(tag,in_stack_00000028),context,ec);
    }
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_begin_multi_dim(const jsoncons::span<const size_t>& shape,
        semantic_tag tag,
        const ser_context& context, 
        std::error_code& ec) override
    {
        switch (tag)
        {
            case semantic_tag::multi_dim_column_major:
                write_tag(1040);
                break;
            default:
                write_tag(40);
                break;
        }
        visit_begin_array(2, semantic_tag::none, context, ec);
        if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
        visit_begin_array(shape.size(), semantic_tag::none, context, ec);
        if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
        for (auto it = shape.begin(); it != shape.end(); ++it)
        {
            visit_uint64(*it, semantic_tag::none, context, ec);
            if (JSONCONS_UNLIKELY(ec)) {JSONCONS_VISITOR_RETURN;}
        }
        visit_end_array(context, ec);
        JSONCONS_VISITOR_RETURN;
    }